

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O2

void movebubbles(void)

{
  monst *worm;
  xchar xVar1;
  byte *pbVar2;
  container *pcVar3;
  trap *ptVar4;
  bubble **ppbVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  monst *mon;
  obj *poVar9;
  bubble *pbVar10;
  obj *otmp;
  xchar xVar11;
  uint uVar12;
  level *plVar14;
  ulong uVar13;
  
  if (wportal == (trap *)0x0) {
    set_wportal(level);
  }
  vision_recalc(2);
  if (uball != (obj *)0x0) {
    unplacebc();
  }
  ppbVar5 = &bbubbles;
  if (bubble_up == '\0') {
    ppbVar5 = &ebubbles;
  }
  pbVar10 = *ppbVar5;
  while( true ) {
    if (pbVar10 == (bubble *)0x0) {
      bubble_up = bubble_up == '\0';
      ppbVar5 = &ebubbles;
      if ((bool)bubble_up) {
        ppbVar5 = &bbubbles;
      }
      for (pbVar10 = *ppbVar5; pbVar10 != (bubble *)0x0;
          pbVar10 = (&pbVar10->prev)[bubble_up != '\0']) {
        uVar12 = mt_random();
        uVar8 = mt_random();
        uVar6 = (uint)(uVar12 % 3 != 0);
        if (pbVar10->dx == '\0') {
          uVar6 = uVar12 % 3;
        }
        uVar12 = (uint)(uVar8 % 3 != 0);
        if (pbVar10->dy == '\0') {
          uVar12 = uVar8 % 3;
        }
        mv_bubble(level,pbVar10,((int)pbVar10->dx - uVar6) + 1,((int)pbVar10->dy - uVar12) + 1,'\0')
        ;
      }
      if (uball != (obj *)0x0) {
        placebc();
      }
      vision_full_recalc = '\x01';
      return;
    }
    if (pbVar10->cons != (container *)0x0) break;
    uVar12 = (uint)pbVar10->x;
    pbVar2 = pbVar10->bm;
    for (uVar6 = 0; uVar13 = (ulong)uVar12, uVar6 < *pbVar2; uVar6 = uVar6 + 1) {
      uVar8 = (uint)pbVar10->y;
      for (uVar7 = 0; plVar14 = level, uVar7 < pbVar2[1]; uVar7 = uVar7 + 1) {
        if ((1 << ((byte)uVar6 & 0x1f) & (uint)pbVar2[uVar7 + 2]) != 0) {
          if (uVar12 - 1 < 0x4f && uVar8 < 0x15) {
            otmp = level->objects[uVar13][uVar8];
            xVar11 = (xchar)uVar12;
            xVar1 = (xchar)uVar8;
            if (otmp != (obj *)0x0) {
              pcVar3 = (container *)malloc(0x18);
              poVar9 = (obj *)0x0;
              while (otmp != (obj *)0x0) {
                remove_object(otmp);
                otmp->ox = '\0';
                otmp->oy = '\0';
                (otmp->v).v_nexthere = poVar9;
                poVar9 = otmp;
                plVar14 = level;
                otmp = level->objects[uVar13][uVar8];
              }
              pcVar3->x = xVar11;
              pcVar3->y = xVar1;
              pcVar3->what = 0;
              pcVar3->list = poVar9;
              pcVar3->next = pbVar10->cons;
              pbVar10->cons = pcVar3;
            }
            worm = plVar14->monsters[uVar13][uVar8];
            if ((worm != (monst *)0x0) && ((worm->field_0x61 & 2) == 0)) {
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar11;
              pcVar3->y = xVar1;
              pcVar3->what = 1;
              pcVar3->list = worm;
              pcVar3->next = pbVar10->cons;
              pbVar10->cons = pcVar3;
              if (worm->wormno == '\0') {
                remove_monster(plVar14,uVar12,uVar8);
              }
              else {
                remove_worm(worm);
              }
              newsym(uVar12,uVar8);
              worm->mx = '\0';
              worm->my = '\0';
            }
            if ((((u._1052_1_ & 1) == 0) && (uVar12 == (int)u.ux)) && (uVar8 == (int)u.uy)) {
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar11;
              pcVar3->y = xVar1;
              pcVar3->what = 2;
              pcVar3->list = (void *)0x0;
              pcVar3->next = pbVar10->cons;
              pbVar10->cons = pcVar3;
            }
            ptVar4 = t_at(level,uVar12,uVar8);
            if (ptVar4 != (trap *)0x0) {
              pcVar3 = (container *)malloc(0x18);
              pcVar3->x = xVar11;
              pcVar3->y = xVar1;
              pcVar3->what = 3;
              pcVar3->list = ptVar4;
              pcVar3->next = pbVar10->cons;
              pbVar10->cons = pcVar3;
            }
            plVar14 = level;
            *(undefined8 *)(level->locations[uVar13] + uVar8) = 0x1300000014;
            *(undefined4 *)&plVar14->locations[uVar13][uVar8].field_0x8 = 0;
            block_point(uVar12,uVar8);
          }
          else {
            impossible("movebubbles: bad pos (%d,%d)",uVar13,(ulong)uVar8);
          }
        }
        uVar8 = uVar8 + 1;
        pbVar2 = pbVar10->bm;
      }
      uVar12 = uVar12 + 1;
    }
    pbVar10 = (&pbVar10->prev)[bubble_up != '\0'];
  }
  panic("movebubbles: cons != null");
}

Assistant:

void movebubbles(void)
{
	struct bubble *b;
	int x, y, i, j;
	struct trap *btrap;
	static const struct rm water_pos = { S_water, 0, 0, 0, 0, 0,
		WATER /* typ */, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };

	/* set up the portal the first time bubbles are moved */
	if (!wportal) set_wportal(level);

	vision_recalc(2);
	/* keep attached ball&chain separate from bubble objects */
	if (Punished) unplacebc();

	/*
	 * Pick up everything inside of a bubble then fill all bubble
	 * locations.
	 */

	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
	    if (b->cons) panic("movebubbles: cons != null");
	    for (i = 0, x = b->x; i < (int) b->bm[0]; i++, x++)
		for (j = 0, y = b->y; j < (int) b->bm[1]; j++, y++)
		    if (b->bm[j + 2] & (1 << i)) {
			if (!isok(x,y)) {
			    impossible("movebubbles: bad pos (%d,%d)", x,y);
			    continue;
			}

			/* pick up objects, monsters, hero, and traps */
			if (OBJ_AT(x, y)) {
			    struct obj *olist = NULL, *otmp;
			    struct container *cons =
				malloc(sizeof(struct container));

			    while ((otmp = level->objects[x][y]) != 0) {
				remove_object(otmp);
				otmp->ox = otmp->oy = 0;
				otmp->nexthere = olist;
				olist = otmp;
			    }

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_OBJ;
			    cons->list = olist;
			    cons->next = b->cons;
			    b->cons = cons;
			}
			if (MON_AT(level, x,y)) {
			    struct monst *mon = m_at(level, x,y);
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_MON;
			    cons->list = mon;

			    cons->next = b->cons;
			    b->cons = cons;

			    if (mon->wormno)
				remove_worm(mon);
			    else
				remove_monster(level, x, y);

			    newsym(x,y);	/* clean up old position */
			    mon->mx = mon->my = 0;
			}
			if (!u.uswallow && x == u.ux && y == u.uy) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_HERO;
			    cons->list = NULL;

			    cons->next = b->cons;
			    b->cons = cons;
			}
			if ((btrap = t_at(level, x, y)) != 0) {
			    struct container *cons =
				malloc(sizeof(struct container));

			    cons->x = x;
			    cons->y = y;
			    cons->what = CONS_TRAP;
			    cons->list = btrap;

			    cons->next = b->cons;
			    b->cons = cons;
			}

			level->locations[x][y] = water_pos;
			block_point(x,y);
		    }
	}

	/*
	 * Every second time traverse down.  This is because otherwise
	 * all the junk that changes owners when bubbles overlap
	 * would eventually end up in the last bubble in the chain.
	 */

	bubble_up = !bubble_up;
	for (b = bubble_up ? bbubbles : ebubbles; b; b = bubble_up ? b->next : b->prev) {
		int rx = rn2(3), ry = rn2(3);

		mv_bubble(level, b, b->dx + 1 - (!b->dx ? rx : (rx ? 1 : 0)),
			    b->dy + 1 - (!b->dy ? ry : (ry ? 1 : 0)),
			    FALSE);
	}

	/* put attached ball&chain back */
	if (Punished) placebc();
	vision_full_recalc = 1;
}